

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS
ref_facelift_edge_face_watertight
          (REF_FACELIFT ref_facelift,REF_INT edgeid,REF_INT faceid,REF_INT sense,REF_DBL t,
          REF_DBL *uv)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_INT geom;
  REF_INT nodes [27];
  REF_DBL tri_bary [3];
  REF_DBL local_b8;
  REF_DBL edg_bary [3];
  REF_INT tri_cell;
  REF_INT edg_cell;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL tol;
  REF_DBL len;
  REF_DBL dist;
  REF_DBL facexyz [3];
  double local_58;
  REF_DBL edgexyz [3];
  REF_GEOM ref_geom;
  REF_DBL *uv_local;
  REF_DBL t_local;
  uint local_20;
  REF_INT sense_local;
  REF_INT faceid_local;
  REF_INT edgeid_local;
  REF_FACELIFT ref_facelift_local;
  
  edgexyz[2] = (REF_DBL)ref_facelift->grid->geom;
  uv_local = (REF_DBL *)t;
  t_local._4_4_ = sense;
  local_20 = faceid;
  sense_local = edgeid;
  _faceid_local = ref_facelift;
  if (sense == 0) {
    uVar1 = ref_facelift_eval_at
                      (ref_facelift,1,edgeid,(REF_DBL *)&uv_local,&local_58,(REF_DBL *)0x0);
    if (uVar1 == 0) {
      uVar1 = ref_facelift_eval_at(_faceid_local,2,local_20,uv,&dist,(REF_DBL *)0x0);
      if (uVar1 == 0) {
        dVar2 = pow(dist - local_58,2.0);
        dVar3 = pow(facexyz[0] - edgexyz[0],2.0);
        dVar4 = pow(facexyz[1] - edgexyz[1],2.0);
        dVar2 = sqrt(dVar2 + dVar3 + dVar4);
        _ref_private_macro_code_rss_1 = 1e-10;
        dVar3 = sqrt((double)uv_local * (double)uv_local +
                     uv[1] * uv[1] +
                     *uv * *uv +
                     edgexyz[1] * edgexyz[1] + local_58 * local_58 + edgexyz[0] * edgexyz[0]);
        if (1.0 < dVar3) {
          _ref_private_macro_code_rss_1 = dVar3 * 1e-10;
        }
        if (dVar2 <= _ref_private_macro_code_rss_1) {
          ref_facelift_local._4_4_ = 0;
        }
        else {
          uVar1 = ref_facelift_enclosing
                            (_faceid_local,1,sense_local,(REF_DBL *)&uv_local,
                             (REF_INT *)((long)edg_bary + 0x14),&local_b8);
          if (uVar1 == 0) {
            if (edg_bary[2]._4_4_ == -1) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                     ,0x330,"ref_facelift_edge_face_watertight","no enclosing found");
              ref_facelift_local._4_4_ = 1;
            }
            else {
              uVar1 = ref_facelift_enclosing
                                (_faceid_local,2,local_20,uv,(REF_INT *)(edg_bary + 2),
                                 (REF_DBL *)(nodes + 0x1a));
              if (uVar1 == 0) {
                if (edg_bary[2]._0_4_ == -1) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                         ,0x334,"ref_facelift_edge_face_watertight","no enclosing found");
                  ref_facelift_local._4_4_ = 1;
                }
                else {
                  printf("edge %d t %f dist %e tol %e len %e\n",uv_local,dVar2,
                         _ref_private_macro_code_rss_1,dVar3,(ulong)(uint)sense_local);
                  printf("face %d uv %f %f\n",*uv,uv[1],(ulong)local_20);
                  printf("edge xyz %e %e %e\n",local_58,edgexyz[0],edgexyz[1]);
                  printf("face xyz %e %e %e\n",dist,facexyz[0],facexyz[1]);
                  printf("edg bary %f %f %f\n",local_b8,edg_bary[0],edg_bary[1]);
                  printf("tri bary %f %f %f\n",stack0xffffffffffffff28,tri_bary[0],tri_bary[1]);
                  uVar1 = ref_cell_nodes(_faceid_local->edg_cell,edg_bary[2]._4_4_,
                                         &ref_private_macro_code_rss_2);
                  if (uVar1 == 0) {
                    uVar1 = ref_geom_find((REF_GEOM)edgexyz[2],ref_private_macro_code_rss_2,1,
                                          sense_local,&ref_private_macro_code_rss_3);
                    if (uVar1 == 0) {
                      printf("t0 %f\n",
                             *(undefined8 *)
                              (*(long *)((long)edgexyz[2] + 0x18) +
                              (long)(ref_private_macro_code_rss_3 << 1) * 8));
                      uVar1 = ref_geom_find((REF_GEOM)edgexyz[2],geom,1,sense_local,
                                            &ref_private_macro_code_rss_3);
                      if (uVar1 == 0) {
                        printf("t1 %f\n",
                               *(undefined8 *)
                                (*(long *)((long)edgexyz[2] + 0x18) +
                                (long)(ref_private_macro_code_rss_3 << 1) * 8));
                        uVar1 = ref_geom_find((REF_GEOM)edgexyz[2],ref_private_macro_code_rss_2,2,
                                              local_20,&ref_private_macro_code_rss_3);
                        if (uVar1 == 0) {
                          printf("uv0 %f %f along\n",
                                 *(undefined8 *)
                                  (*(long *)((long)edgexyz[2] + 0x18) +
                                  (long)(ref_private_macro_code_rss_3 << 1) * 8),
                                 *(undefined8 *)
                                  (*(long *)((long)edgexyz[2] + 0x18) +
                                  (long)(ref_private_macro_code_rss_3 * 2 + 1) * 8));
                          uVar1 = ref_geom_find((REF_GEOM)edgexyz[2],geom,2,local_20,
                                                &ref_private_macro_code_rss_3);
                          if (uVar1 == 0) {
                            printf("uv1 %f %f along\n",
                                   *(undefined8 *)
                                    (*(long *)((long)edgexyz[2] + 0x18) +
                                    (long)(ref_private_macro_code_rss_3 << 1) * 8),
                                   *(undefined8 *)
                                    (*(long *)((long)edgexyz[2] + 0x18) +
                                    (long)(ref_private_macro_code_rss_3 * 2 + 1) * 8));
                            uVar1 = ref_cell_nodes(_faceid_local->tri_cell,edg_bary[2]._0_4_,
                                                   &ref_private_macro_code_rss_2);
                            if (uVar1 == 0) {
                              uVar1 = ref_geom_find((REF_GEOM)edgexyz[2],
                                                    ref_private_macro_code_rss_2,2,local_20,
                                                    &ref_private_macro_code_rss_3);
                              if (uVar1 == 0) {
                                printf("uv0 %f %f\n",
                                       *(undefined8 *)
                                        (*(long *)((long)edgexyz[2] + 0x18) +
                                        (long)(ref_private_macro_code_rss_3 << 1) * 8),
                                       *(undefined8 *)
                                        (*(long *)((long)edgexyz[2] + 0x18) +
                                        (long)(ref_private_macro_code_rss_3 * 2 + 1) * 8));
                                uVar1 = ref_geom_find((REF_GEOM)edgexyz[2],geom,2,local_20,
                                                      &ref_private_macro_code_rss_3);
                                if (uVar1 == 0) {
                                  printf("uv1 %f %f\n",
                                         *(undefined8 *)
                                          (*(long *)((long)edgexyz[2] + 0x18) +
                                          (long)(ref_private_macro_code_rss_3 << 1) * 8),
                                         *(undefined8 *)
                                          (*(long *)((long)edgexyz[2] + 0x18) +
                                          (long)(ref_private_macro_code_rss_3 * 2 + 1) * 8));
                                  uVar1 = ref_geom_find((REF_GEOM)edgexyz[2],nodes[0],2,local_20,
                                                        &ref_private_macro_code_rss_3);
                                  if (uVar1 == 0) {
                                    printf("uv2 %f %f\n",
                                           *(undefined8 *)
                                            (*(long *)((long)edgexyz[2] + 0x18) +
                                            (long)(ref_private_macro_code_rss_3 << 1) * 8),
                                           *(undefined8 *)
                                            (*(long *)((long)edgexyz[2] + 0x18) +
                                            (long)(ref_private_macro_code_rss_3 * 2 + 1) * 8));
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                           ,0x358,"ref_facelift_edge_face_watertight",
                                           "not watertight within tol");
                                    ref_facelift_local._4_4_ = 1;
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                           ,0x354,"ref_facelift_edge_face_watertight",(ulong)uVar1,
                                           "gm");
                                    ref_facelift_local._4_4_ = uVar1;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                         ,0x351,"ref_facelift_edge_face_watertight",(ulong)uVar1,
                                         "gm");
                                  ref_facelift_local._4_4_ = uVar1;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                       ,0x34e,"ref_facelift_edge_face_watertight",(ulong)uVar1,"gm")
                                ;
                                ref_facelift_local._4_4_ = uVar1;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                     ,0x34d,"ref_facelift_edge_face_watertight",(ulong)uVar1,"nodes"
                                    );
                              ref_facelift_local._4_4_ = uVar1;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                   ,0x348,"ref_facelift_edge_face_watertight",(ulong)uVar1,"gm");
                            ref_facelift_local._4_4_ = uVar1;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                                 ,0x345,"ref_facelift_edge_face_watertight",(ulong)uVar1,"gm");
                          ref_facelift_local._4_4_ = uVar1;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                               ,0x342,"ref_facelift_edge_face_watertight",(ulong)uVar1,"gm");
                        ref_facelift_local._4_4_ = uVar1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                             ,0x340,"ref_facelift_edge_face_watertight",(ulong)uVar1,"gm");
                      ref_facelift_local._4_4_ = uVar1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                           ,0x33f,"ref_facelift_edge_face_watertight",(ulong)uVar1,"nodes");
                    ref_facelift_local._4_4_ = uVar1;
                  }
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                       ,0x333,"ref_facelift_edge_face_watertight",(ulong)uVar1,"enclose");
                ref_facelift_local._4_4_ = uVar1;
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x32f,"ref_facelift_edge_face_watertight",(ulong)uVar1,"enclose");
            ref_facelift_local._4_4_ = uVar1;
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               800,"ref_facelift_edge_face_watertight",(ulong)uVar1,"eval face");
        ref_facelift_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x31d,"ref_facelift_edge_face_watertight",(ulong)uVar1,"eval edge");
      ref_facelift_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x319,"ref_facelift_edge_face_watertight","implement sense != 0 for uv jumps");
    ref_facelift_local._4_4_ = 1;
  }
  return ref_facelift_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_edge_face_watertight(REF_FACELIFT ref_facelift,
                                                     REF_INT edgeid,
                                                     REF_INT faceid,
                                                     REF_INT sense, REF_DBL t,
                                                     REF_DBL *uv) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_DBL edgexyz[3], facexyz[3], dist;
  REF_DBL len, tol;
  RAS(0 == sense, "implement sense != 0 for uv jumps");

  RSS(ref_facelift_eval_at(ref_facelift, REF_GEOM_EDGE, edgeid, &t, edgexyz,
                           NULL),
      "eval edge");
  RSS(ref_facelift_eval_at(ref_facelift, REF_GEOM_FACE, faceid, uv, facexyz,
                           NULL),
      "eval face");
  dist =
      sqrt(pow(facexyz[0] - edgexyz[0], 2) + pow(facexyz[1] - edgexyz[1], 2) +
           pow(facexyz[2] - edgexyz[2], 2));
  tol = 1.0e-10; /* increase tol if not O(1) */
  len = sqrt(ref_math_dot(edgexyz, edgexyz) + uv[0] * uv[0] + uv[1] * uv[1] +
             t * t);
  if (len > 1.0) tol = tol * len;
  if (dist > tol) {
    REF_INT edg_cell, tri_cell;
    REF_DBL edg_bary[3], tri_bary[3];
    REF_INT nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT geom;
    RSS(ref_facelift_enclosing(ref_facelift, REF_GEOM_EDGE, edgeid, &t,
                               &edg_cell, edg_bary),
        "enclose");
    RUS(REF_EMPTY, edg_cell, "no enclosing found");
    RSS(ref_facelift_enclosing(ref_facelift, REF_GEOM_FACE, faceid, uv,
                               &tri_cell, tri_bary),
        "enclose");
    RUS(REF_EMPTY, tri_cell, "no enclosing found");

    printf("edge %d t %f dist %e tol %e len %e\n", edgeid, t, dist, tol, len);
    printf("face %d uv %f %f\n", faceid, uv[0], uv[1]);
    printf("edge xyz %e %e %e\n", edgexyz[0], edgexyz[1], edgexyz[2]);
    printf("face xyz %e %e %e\n", facexyz[0], facexyz[1], facexyz[2]);

    printf("edg bary %f %f %f\n", edg_bary[0], edg_bary[1], edg_bary[2]);
    printf("tri bary %f %f %f\n", tri_bary[0], tri_bary[1], tri_bary[2]);

    RSS(ref_cell_nodes(ref_facelift_edg(ref_facelift), edg_cell, nodes),
        "nodes");
    RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_EDGE, edgeid, &geom), "gm");
    printf("t0 %f\n", ref_geom_param(ref_geom, 0, geom));
    RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_EDGE, edgeid, &geom), "gm");
    printf("t1 %f\n", ref_geom_param(ref_geom, 0, geom));

    RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv0 %f %f along\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));
    RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv1 %f %f along\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));

    RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), tri_cell, nodes),
        "nodes");
    RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv0 %f %f\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));
    RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv1 %f %f\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));
    RSS(ref_geom_find(ref_geom, nodes[2], REF_GEOM_FACE, faceid, &geom), "gm");
    printf("uv2 %f %f\n", ref_geom_param(ref_geom, 0, geom),
           ref_geom_param(ref_geom, 1, geom));

    THROW("not watertight within tol");
  }
  return REF_SUCCESS;
}